

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::SetUpAttrCatAttributes(SM_Manager *this,DataAttrInfo *attributes)

{
  int local_20;
  int i;
  int numAttr;
  DataAttrInfo *attributes_local;
  SM_Manager *this_local;
  
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    builtin_strncpy(attributes[local_20].relName,"attrcat",8);
    attributes[local_20].indexNo = 0;
  }
  builtin_strncpy(attributes->attrName,"relName",8);
  builtin_strncpy(attributes->attrName + 8,"tupleLength",0xc);
  builtin_strncpy(attributes->attrName + 0x14,"attrC",5);
  attributes[1].attrName[0] = 'a';
  attributes[1].attrName[1] = 't';
  attributes[1].attrName[2] = 't';
  attributes[1].attrName[3] = 'r';
  attributes[1].attrName[4] = 'N';
  attributes[1].attrName[5] = 'a';
  attributes[1].attrName[6] = 'm';
  attributes[1].attrName[7] = 'e';
  attributes[1].attrName[8] = '\0';
  attributes[1].attrName[9] = 'o';
  attributes[1].attrName[10] = 'f';
  attributes[1].attrName[0xb] = 'f';
  attributes[1].attrName[0xc] = 's';
  attributes[1].attrName[0xd] = 'e';
  attributes[1].attrName[0xe] = 't';
  attributes[1].attrName[0xf] = '\0';
  attributes[1].attrName[0x10] = 'a';
  attributes[1].attrName[0x11] = 't';
  attributes[1].attrName[0x12] = 't';
  attributes[1].attrName[0x13] = 'r';
  attributes[1].attrName[0x14] = 'T';
  attributes[1].attrName[0x15] = 'y';
  attributes[1].attrName[0x16] = 'p';
  attributes[1].attrName[0x17] = 'e';
  attributes[1].attrName[0x18] = '\0';
  attributes[2].attrName[0] = 'o';
  attributes[2].attrName[1] = 'f';
  attributes[2].attrName[2] = 'f';
  attributes[2].attrName[3] = 's';
  attributes[2].attrName[4] = 'e';
  attributes[2].attrName[5] = 't';
  attributes[2].attrName[6] = '\0';
  attributes[2].attrName[7] = 'a';
  attributes[2].attrName[8] = 't';
  attributes[2].attrName[9] = 't';
  attributes[2].attrName[10] = 'r';
  attributes[2].attrName[0xb] = 'T';
  attributes[2].attrName[0xc] = 'y';
  attributes[2].attrName[0xd] = 'p';
  attributes[2].attrName[0xe] = 'e';
  attributes[2].attrName[0xf] = '\0';
  attributes[2].attrName[0x10] = 'a';
  attributes[2].attrName[0x11] = 't';
  attributes[2].attrName[0x12] = 't';
  attributes[2].attrName[0x13] = 'r';
  attributes[2].attrName[0x14] = 'L';
  attributes[2].attrName[0x15] = 'e';
  attributes[2].attrName[0x16] = 'n';
  attributes[2].attrName[0x17] = 'g';
  attributes[2].attrName[0x18] = 't';
  attributes[3].attrName[0] = 'a';
  attributes[3].attrName[1] = 't';
  attributes[3].attrName[2] = 't';
  attributes[3].attrName[3] = 'r';
  attributes[3].attrName[4] = 'T';
  attributes[3].attrName[5] = 'y';
  attributes[3].attrName[6] = 'p';
  attributes[3].attrName[7] = 'e';
  attributes[3].attrName[8] = '\0';
  attributes[3].attrName[9] = 'a';
  attributes[3].attrName[10] = 't';
  attributes[3].attrName[0xb] = 't';
  attributes[3].attrName[0xc] = 'r';
  attributes[3].attrName[0xd] = 'L';
  attributes[3].attrName[0xe] = 'e';
  attributes[3].attrName[0xf] = 'n';
  attributes[3].attrName[0x10] = 'g';
  attributes[3].attrName[0x11] = 't';
  attributes[3].attrName[0x12] = 'h';
  attributes[3].attrName[0x13] = '\0';
  attributes[3].attrName[0x14] = 'i';
  attributes[3].attrName[0x15] = 'n';
  attributes[3].attrName[0x16] = 'd';
  attributes[3].attrName[0x17] = 'e';
  attributes[3].attrName[0x18] = 'x';
  attributes[4].attrName[0] = 'a';
  attributes[4].attrName[1] = 't';
  attributes[4].attrName[2] = 't';
  attributes[4].attrName[3] = 'r';
  attributes[4].attrName[4] = 'L';
  attributes[4].attrName[5] = 'e';
  attributes[4].attrName[6] = 'n';
  attributes[4].attrName[7] = 'g';
  attributes[4].attrName[8] = 't';
  attributes[4].attrName[9] = 'h';
  attributes[4].attrName[10] = '\0';
  attributes[4].attrName[0xb] = 'i';
  attributes[4].attrName[0xc] = 'n';
  attributes[4].attrName[0xd] = 'd';
  attributes[4].attrName[0xe] = 'e';
  attributes[4].attrName[0xf] = 'x';
  attributes[4].attrName[0x10] = 'N';
  attributes[4].attrName[0x11] = 'o';
  attributes[4].attrName[0x12] = '\0';
  attributes[4].attrName[0x13] = 'P';
  attributes[4].attrName[0x14] = 'r';
  attributes[4].attrName[0x15] = 'i';
  attributes[4].attrName[0x16] = 'n';
  attributes[4].attrName[0x17] = 't';
  attributes[4].attrName[0x18] = 'i';
  attributes[5].attrName[0] = 'i';
  attributes[5].attrName[1] = 'n';
  attributes[5].attrName[2] = 'd';
  attributes[5].attrName[3] = 'e';
  attributes[5].attrName[4] = 'x';
  attributes[5].attrName[5] = 'N';
  attributes[5].attrName[6] = 'o';
  attributes[5].attrName[7] = '\0';
  attributes[5].attrName[8] = 'P';
  attributes[5].attrName[9] = 'r';
  attributes[5].attrName[10] = 'i';
  attributes[5].attrName[0xb] = 'n';
  attributes[5].attrName[0xc] = 't';
  attributes[5].attrName[0xd] = 'i';
  attributes[5].attrName[0xe] = 'n';
  attributes[5].attrName[0xf] = 'g';
  attributes[5].attrName[0x10] = ' ';
  attributes[5].attrName[0x11] = 's';
  attributes[5].attrName[0x12] = 't';
  attributes[5].attrName[0x13] = 'a';
  attributes[5].attrName[0x14] = 't';
  attributes[5].attrName[0x15] = 's';
  attributes[5].attrName[0x16] = ' ';
  attributes[5].attrName[0x17] = 'f';
  attributes[5].attrName[0x18] = 'o';
  attributes->offset = 0;
  attributes[1].offset = 0x19;
  attributes[2].offset = 0x34;
  attributes[3].offset = 0x38;
  attributes[4].offset = 0x3c;
  attributes[5].offset = 0x40;
  attributes->attrType = STRING;
  attributes[1].attrType = STRING;
  attributes[2].attrType = INT;
  attributes[3].attrType = INT;
  attributes[4].attrType = INT;
  attributes[5].attrType = INT;
  attributes->attrLength = 0x19;
  attributes[1].attrLength = 0x19;
  attributes[2].attrLength = 4;
  attributes[3].attrLength = 4;
  attributes[4].attrLength = 4;
  attributes[5].attrLength = 4;
  return 0;
}

Assistant:

RC SM_Manager::SetUpAttrCatAttributes(DataAttrInfo *attributes){
  int numAttr = 6;
  for(int i= 0; i < numAttr; i++){
    memcpy(attributes[i].relName, "attrcat", strlen("attrcat") + 1);
    attributes[i].indexNo = 0;
  }
  
  memcpy(attributes[0].attrName, "relName", MAXNAME + 1);
  memcpy(attributes[1].attrName, "attrName", MAXNAME + 1);
  memcpy(attributes[2].attrName, "offset", MAXNAME + 1);
  memcpy(attributes[3].attrName, "attrType", MAXNAME + 1);
  memcpy(attributes[4].attrName, "attrLength", MAXNAME + 1);
  memcpy(attributes[5].attrName, "indexNo", MAXNAME + 1);

  attributes[0].offset = (int) offsetof(AttrCatEntry,relName);
  attributes[1].offset = (int) offsetof(AttrCatEntry,attrName);
  attributes[2].offset = (int) offsetof(AttrCatEntry,offset);
  attributes[3].offset = (int) offsetof(AttrCatEntry,attrType);
  attributes[4].offset = (int) offsetof(AttrCatEntry,attrLength);
  attributes[5].offset = (int) offsetof(AttrCatEntry,indexNo);

  attributes[0].attrType = STRING;
  attributes[1].attrType = STRING;
  attributes[2].attrType = INT;
  attributes[3].attrType = INT;
  attributes[4].attrType = INT;
  attributes[5].attrType = INT;

  attributes[0].attrLength = MAXNAME + 1;
  attributes[1].attrLength = MAXNAME + 1;
  attributes[2].attrLength = 4;
  attributes[3].attrLength = 4;
  attributes[4].attrLength = 4;
  attributes[5].attrLength = 4;

  return (0);
}